

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHandler.cpp
# Opt level: O2

int __thiscall VideoHandler::preProcess(VideoHandler *this,string *videoInFile,string *targetName)

{
  element_type *peVar1;
  char cVar2;
  ostream *poVar3;
  __shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::make_shared<cv::VideoCapture,char_const*>((char **)&local_28);
  std::__shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_cap).super___shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  peVar1 = (this->m_cap).super___shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) &&
     (cVar2 = (**(code **)(*(long *)peVar1 + 0x30))(), cVar2 != '\0')) {
    std::__cxx11::string::_M_assign((string *)&this->m_targetName);
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Error open video file");
  std::endl<char,std::char_traits<char>>(poVar3);
  return -1;
}

Assistant:

int VideoHandler::preProcess(const std::string &videoInFile, const std::string &targetName) 
{
    m_cap = std::make_shared<cv::VideoCapture>(videoInFile.c_str());
    if (!m_cap || !m_cap->isOpened()) 
    {
        std::cout << "Error open video file" << std::endl;
        return -1;
    }
 
    m_targetName = targetName;
    return 0;
}